

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4s.c
# Opt level: O3

void streamStateFree(roslz4_stream *str)

{
  void *__ptr;
  
  __ptr = str->state;
  if (__ptr != (void *)0x0) {
    if (*(void **)((long)__ptr + 0x10) != (void *)0x0) {
      free(*(void **)((long)__ptr + 0x10));
    }
    if (*(void **)((long)__ptr + 0x28) != (void *)0x0) {
      XXH32_digest(*(void **)((long)__ptr + 0x28));
    }
    free(__ptr);
    str->state = (void *)0x0;
  }
  return;
}

Assistant:

void streamStateFree(roslz4_stream *str) {
  stream_state *state = str->state;
  if (state != NULL) {
    if (state->buffer != NULL) {
      free(state->buffer);
    }
    if (state->xxh32_state != NULL) {
      XXH32_digest(state->xxh32_state);
    }
    free(state);
    str->state = NULL;
  }
}